

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O2

ENetProtocolCommand
enet_protocol_remove_sent_reliable_command
          (ENetPeer *peer,uint16_t reliableSequenceNumber,uint8_t channelID)

{
  uint32_t *puVar1;
  byte *pbVar2;
  ENetList *pEVar3;
  ENetChannel *pEVar4;
  _ENetListNode *p_Var5;
  _ENetListNode *p_Var6;
  ENetPacket *packet;
  ulong uVar7;
  _ENetListNode *p_Var8;
  byte bVar9;
  uint16_t uVar10;
  _ENetListNode *p_Var11;
  
  pEVar3 = &peer->sentReliableCommands;
  p_Var8 = &pEVar3->sentinel;
  do {
    p_Var8 = ((ENetListNode *)&p_Var8->next)->next;
    if (p_Var8 == &pEVar3->sentinel) {
      p_Var11 = &(peer->outgoingCommands).sentinel;
      goto LAB_0010796b;
    }
  } while ((*(uint16_t *)&p_Var8[1].next != reliableSequenceNumber) ||
          (p_Var11 = p_Var8, *(undefined1 *)((long)&p_Var8[2].previous + 1) != channelID));
  goto LAB_00107990;
  while ((*(uint16_t *)&p_Var11[1].next != reliableSequenceNumber ||
         (*(undefined1 *)((long)&p_Var11[2].previous + 1) != channelID))) {
LAB_0010796b:
    p_Var11 = p_Var11->next;
    if ((p_Var11 == &(peer->outgoingCommands).sentinel) ||
       (*(short *)((long)&p_Var11[2].next + 6) == 0)) {
      bVar9 = 0;
      goto LAB_00107a24;
    }
  }
LAB_00107990:
  uVar7 = (ulong)channelID;
  if (uVar7 < peer->channelCount) {
    pEVar4 = peer->channels;
    if ((pEVar4[uVar7].reliableWindows[reliableSequenceNumber >> 0xc] != 0) &&
       (uVar10 = pEVar4[uVar7].reliableWindows[reliableSequenceNumber >> 0xc] - 1,
       pEVar4[uVar7].reliableWindows[reliableSequenceNumber >> 0xc] = uVar10, uVar10 == 0)) {
      bVar9 = (byte)(reliableSequenceNumber >> 0xc);
      pEVar4[uVar7].usedReliableWindows =
           pEVar4[uVar7].usedReliableWindows & (-2 << bVar9 | 0xfffeU >> 0x10 - bVar9);
    }
  }
  bVar9 = *(byte *)&p_Var11[2].previous;
  p_Var5 = p_Var11->next;
  p_Var6 = p_Var11->previous;
  p_Var6->next = p_Var5;
  p_Var5->previous = p_Var6;
  packet = (ENetPacket *)p_Var11[5].previous;
  if (packet != (ENetPacket *)0x0) {
    if (p_Var8 != &pEVar3->sentinel) {
      peer->reliableDataInTransit =
           peer->reliableDataInTransit - (uint)*(ushort *)((long)&p_Var11[2].next + 4);
    }
    puVar1 = &packet->referenceCount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      pbVar2 = (byte *)((long)&packet->flags + 1);
      *pbVar2 = *pbVar2 | 1;
      enet_packet_destroy(packet);
    }
  }
  bVar9 = bVar9 & 0xf;
  (*(code *)callbacks_1)(p_Var11);
  p_Var8 = (pEVar3->sentinel).next;
  if (p_Var8 != &pEVar3->sentinel) {
    peer->nextTimeout = *(int *)&p_Var8[1].previous + *(int *)((long)&p_Var8[1].next + 4);
  }
LAB_00107a24:
  return (ENetProtocolCommand)bVar9;
}

Assistant:

static ENetProtocolCommand enet_protocol_remove_sent_reliable_command(ENetPeer* peer, uint16_t reliableSequenceNumber, uint8_t channelID) {
	ENetOutgoingCommand* outgoingCommand = NULL;
	ENetListIterator currentCommand;
	ENetProtocolCommand commandNumber;

	int wasSent = 1;

	for (currentCommand = enet_list_begin(&peer->sentReliableCommands); currentCommand != enet_list_end(&peer->sentReliableCommands); currentCommand = enet_list_next(currentCommand)) {
		outgoingCommand = (ENetOutgoingCommand*)currentCommand;

		if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
			break;
	}

	if (currentCommand == enet_list_end(&peer->sentReliableCommands)) {
		for (currentCommand = enet_list_begin(&peer->outgoingCommands); currentCommand != enet_list_end(&peer->outgoingCommands); currentCommand = enet_list_next(currentCommand)) {
			outgoingCommand = (ENetOutgoingCommand*)currentCommand;

			if (outgoingCommand->sendAttempts < 1)
				return ENET_PROTOCOL_COMMAND_NONE;

			if (outgoingCommand->reliableSequenceNumber == reliableSequenceNumber && outgoingCommand->command.header.channelID == channelID)
				break;
		}

		if (currentCommand == enet_list_end(&peer->outgoingCommands))
			return ENET_PROTOCOL_COMMAND_NONE;

		wasSent = 0;
	}

	if (outgoingCommand == NULL)
		return ENET_PROTOCOL_COMMAND_NONE;

	if (channelID < peer->channelCount) {
		ENetChannel* channel = &peer->channels[channelID];
		uint16_t reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

		if (channel->reliableWindows[reliableWindow] > 0) {
			--channel->reliableWindows[reliableWindow];

			if (!channel->reliableWindows[reliableWindow])
				channel->usedReliableWindows &= ~(1 << reliableWindow);
		}
	}

	commandNumber = (ENetProtocolCommand)(outgoingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK);

	enet_list_remove(&outgoingCommand->outgoingCommandList);

	if (outgoingCommand->packet != NULL) {
		if (wasSent)
			peer->reliableDataInTransit -= outgoingCommand->fragmentLength;

		--outgoingCommand->packet->referenceCount;

		if (outgoingCommand->packet->referenceCount == 0) {
			outgoingCommand->packet->flags |= ENET_PACKET_FLAG_SENT;

			enet_packet_destroy(outgoingCommand->packet);
		}
	}

	enet_free(outgoingCommand);

	if (enet_list_empty(&peer->sentReliableCommands))
		return commandNumber;

	outgoingCommand = (ENetOutgoingCommand*)enet_list_front(&peer->sentReliableCommands);
	peer->nextTimeout = outgoingCommand->sentTime + outgoingCommand->roundTripTimeout;

	return commandNumber;
}